

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall QAbstractSpinBox::wheelEvent(QAbstractSpinBox *this,QWheelEvent *event)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  lVar1 = *(long *)(this + 8);
  iVar6 = *(int *)(lVar1 + 0x3ac) + *(int *)(event + 0x5c);
  uVar2 = (long)iVar6 / 0x78;
  iVar4 = (int)uVar2;
  *(int *)(lVar1 + 0x3ac) = iVar4 * -0x78 + iVar6;
  bVar3 = (**(code **)(*(long *)this + 0x1c8))(this,event,(long)iVar6 % 0x78 & 0xffffffff);
  if ((bVar3 & (iVar6 < 0x78) + 1U) != 0) {
    uVar5 = (ulong)(uint)(iVar4 * 10);
    if ((*(uint *)(event + 0x20) & *(uint *)(lVar1 + 0x3b4)) == 0) {
      uVar5 = uVar2 & 0xffffffff;
    }
    (**(code **)(*(long *)this + 0x1b0))(this,uVar5);
  }
  event[0xc] = (QWheelEvent)0x1;
  return;
}

Assistant:

void QAbstractSpinBox::wheelEvent(QWheelEvent *event)
{
    Q_D(QAbstractSpinBox);
#ifdef Q_OS_MACOS
    // If the event comes from a real mouse wheel, rather than a track pad
    // (Qt::MouseEventSynthesizedBySystem), the shift modifier changes the
    // scroll orientation to horizontal.
    // Convert horizontal events back to vertical whilst shift is held.
    if ((event->modifiers() & Qt::ShiftModifier)
            && event->source() == Qt::MouseEventNotSynthesized) {
        d->wheelDeltaRemainder += event->angleDelta().x();
    } else {
        d->wheelDeltaRemainder += event->angleDelta().y();
    }
#else
    d->wheelDeltaRemainder += event->angleDelta().y();
#endif
    const int steps = d->wheelDeltaRemainder / 120;
    d->wheelDeltaRemainder -= steps * 120;
    if (stepEnabled() & (steps > 0 ? StepUpEnabled : StepDownEnabled))
        stepBy(event->modifiers() & d->stepModifier ? steps * 10 : steps);
    event->accept();
}